

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O0

void __thiscall
duckdb::MultiFileLocalState::MultiFileLocalState(MultiFileLocalState *this,ClientContext *context)

{
  ExpressionExecutor *in_RSI;
  LocalTableFunctionState *in_RDI;
  DataChunk *this_00;
  ClientContext *in_stack_ffffffffffffffe8;
  
  LocalTableFunctionState::LocalTableFunctionState(in_RDI);
  in_RDI->_vptr_LocalTableFunctionState = (_func_int **)&PTR__MultiFileLocalState_0351e650;
  shared_ptr<duckdb::BaseFileReader,_true>::shared_ptr
            ((shared_ptr<duckdb::BaseFileReader,_true> *)0x14d619e);
  optional_ptr<duckdb::MultiFileReaderData,_true>::optional_ptr
            ((optional_ptr<duckdb::MultiFileReaderData,_true> *)(in_RDI + 3));
  in_RDI[6]._vptr_LocalTableFunctionState = (_func_int **)0xffffffffffffffff;
  this_00 = (DataChunk *)(in_RDI + 7);
  unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
  ::unique_ptr((unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                *)0x14d61c9);
  DataChunk::DataChunk(this_00);
  ExpressionExecutor::ExpressionExecutor(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit MultiFileLocalState(ClientContext &context) : executor(context) {
	}